

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Codec.h
# Opt level: O1

void __thiscall
sznet::net::LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>_>::onMessage
          (LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>_> *this,
          shared_ptr<sznet::net::TcpConnection> *conn,Buffer *buf,Timestamp receiveTime)

{
  int v;
  ulong uVar1;
  pointer pcVar2;
  size_t sVar3;
  SourceFile file;
  undefined1 local_1010 [8];
  string message;
  char *local_60 [4];
  Timestamp local_40;
  shared_ptr<sznet::net::TcpConnection> *local_38;
  
  sVar3 = buf->m_readerIndex;
  uVar1 = buf->m_writerIndex - sVar3;
  if (3 < uVar1) {
    local_38 = conn;
    do {
      v = *(int *)((buf->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + sVar3);
      sVar3 = (size_t)v;
      if ((long)sVar3 < 0) {
        file._8_8_ = 7;
        file.m_data = "Codec.h";
        Logger::Logger((Logger *)local_1010,file,0x2b,ERROR);
        if (((int)local_60 - (int)local_60[0] & 0xfffffff0U) != 0) {
          builtin_strncpy(local_60[0],"Invalid length ",0xf);
          local_60[0] = local_60[0] + 0xf;
        }
        LogStream::operator<<((LogStream *)&message,v);
        Logger::~Logger((Logger *)local_1010);
        TcpConnection::forceClose
                  ((local_38->
                   super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  );
        return;
      }
      if (uVar1 < sVar3 + 4) {
        return;
      }
      Buffer::retrieve(buf,4);
      pcVar2 = (buf->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + buf->m_readerIndex;
      local_1010 = (undefined1  [8])&message._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1010,pcVar2,pcVar2 + sVar3);
      local_40.m_microSecondsSinceEpoch = receiveTime.m_microSecondsSinceEpoch;
      if ((this->m_messageCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->m_messageCallback)._M_invoker)
                ((_Any_data *)this,local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1010,
                 &local_40);
      Buffer::retrieve(buf,sVar3);
      if (local_1010 != (undefined1  [8])&message._M_string_length) {
        operator_delete((void *)local_1010);
      }
      sVar3 = buf->m_readerIndex;
      uVar1 = buf->m_writerIndex - sVar3;
    } while (3 < uVar1);
  }
  return;
}

Assistant:

void onMessage(const TSPTR& conn, Buffer* buf, Timestamp receiveTime)
	{
		// kHeaderLen == 4
		while (buf->readableBytes() >= kHeaderLen)
		{
			// FIXME: use Buffer::peekInt32()
			const void* data = buf->peek();
			// SIGBUS
			const int32_t len = *static_cast<const int32_t*>(data);
			if (len < 0)
			{
				LOG_ERROR << "Invalid length " << len;
				conn->forceClose();
				break;
			}
			else if (buf->readableBytes() >= len + kHeaderLen)
			{
				buf->retrieve(kHeaderLen);
				string message(buf->peek(), len);
				m_messageCallback(conn, message, receiveTime);
				buf->retrieve(len);
			}
			else
			{
				break;
			}
		}
	}